

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O2

float __thiscall IGameController::EvaluateSpawnPos(IGameController *this,CSpawnEval *pEval,vec2 Pos)

{
  CEntity *pCVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_18;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_14;
  
  pCVar1 = CGameWorld::FindFirst(&this->m_pGameServer->m_World,3);
  local_18 = Pos.field_0;
  aStack_14 = Pos.field_1;
  fVar3 = 0.0;
  for (; pCVar1 != (CEntity *)0x0; pCVar1 = pCVar1->m_pNextTypeEntity) {
    fVar4 = 1.0;
    if ((pEval->m_FriendlyTeam != -1) &&
       (fVar4 = 1.0, *(int *)(pCVar1[1]._vptr_CEntity + 0x81) == pEval->m_FriendlyTeam)) {
      fVar4 = 0.5;
    }
    fVar5 = local_18.x - (pCVar1->m_Pos).field_0.x;
    fVar6 = aStack_14.y - (pCVar1->m_Pos).field_1.y;
    fVar5 = SQRT(fVar5 * fVar5 + fVar6 * fVar6);
    uVar2 = -(uint)(fVar5 == 0.0);
    fVar3 = fVar3 + (float)(uVar2 & 0x4e6e6b28 | ~uVar2 & (uint)(1.0 / fVar5)) * fVar4;
  }
  return fVar3;
}

Assistant:

float IGameController::EvaluateSpawnPos(CSpawnEval *pEval, vec2 Pos) const
{
	float Score = 0.0f;
	CCharacter *pC = static_cast<CCharacter *>(GameServer()->m_World.FindFirst(CGameWorld::ENTTYPE_CHARACTER));
	for(; pC; pC = (CCharacter *)pC->TypeNext())
	{
		// team mates are not as dangerous as enemies
		float Scoremod = 1.0f;
		if(pEval->m_FriendlyTeam != -1 && pC->GetPlayer()->GetTeam() == pEval->m_FriendlyTeam)
			Scoremod = 0.5f;

		float d = distance(Pos, pC->GetPos());
		Score += Scoremod * (d == 0 ? 1000000000.0f : 1.0f/d);
	}

	return Score;
}